

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O2

int __thiscall Clique::init(Clique *this,EVP_PKEY_CTX *ctx)

{
  alignment_set_t *paVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  AlignmentRecord *this_00;
  
  this->alignment_count = 0;
  iVar6 = 0;
  for (uVar7 = 0; paVar1 = this->alignment_set, uVar7 < paVar1->m_num_bits; uVar7 = uVar7 + 1) {
    if (((paVar1->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) {
      iVar2 = (*this->parent->_vptr_CliqueFinder[5])(this->parent,uVar7);
      this_00 = (AlignmentRecord *)CONCAT44(extraout_var,iVar2);
      uVar3 = AlignmentRecord::getIntervalStart(this_00);
      uVar4 = (ulong)uVar3;
      if (iVar6 == 0) {
        this->leftmost_segment_start = uVar4;
        uVar3 = AlignmentRecord::getIntervalEnd(this_00);
        uVar4 = (ulong)uVar3;
      }
      else {
        uVar5 = this->leftmost_segment_start;
        if (uVar4 <= this->leftmost_segment_start) {
          uVar5 = uVar4;
        }
        this->leftmost_segment_start = uVar5;
        uVar3 = AlignmentRecord::getIntervalEnd(this_00);
        uVar4 = this->rightmost_segment_end;
        if (this->rightmost_segment_end <= (ulong)uVar3) {
          uVar4 = (ulong)uVar3;
        }
      }
      iVar6 = iVar6 + 1;
      this->rightmost_segment_end = uVar4;
      this->alignment_count = this->alignment_count + 1;
    }
  }
  return (int)paVar1;
}

Assistant:

void Clique::init() {
	int n = 0;
	alignment_count = 0;
	// for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
	for (size_t i=0; i<alignment_set->size(); ++i) {
		if (!alignment_set->test(i)) continue;
		const AlignmentRecord& ap = parent.getAlignmentByIndex(i);
		if (n++==0) {
			leftmost_segment_start = ap.getIntervalStart();
			rightmost_segment_end = ap.getIntervalEnd();
		} else {
			leftmost_segment_start = min(leftmost_segment_start, (size_t)ap.getIntervalStart());
			rightmost_segment_end = max(rightmost_segment_end, (size_t)ap.getIntervalEnd());
		}
		alignment_count += 1;
	}
}